

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

float deqp::gles3::Functional::MatrixCaseUtils::determinant<4>(Matrix<float,_4,_4> *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  int row_3;
  float *pfVar9;
  int row_2;
  int row_1;
  float *pfVar10;
  int row;
  long lVar11;
  int col_1;
  float *pfVar12;
  int col;
  long lVar13;
  float local_158 [12];
  float local_128 [12];
  float local_f8 [12];
  float local_c8 [12];
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  uVar5 = *(undefined8 *)((mat->m_data).m_data[1].m_data + 2);
  uStack_40 = (undefined4)uVar5;
  uStack_90 = (undefined4)((ulong)uVar5 >> 0x20);
  pfVar8 = (mat->m_data).m_data[1].m_data + 1;
  fStack_44 = *pfVar8;
  fStack_8c = (mat->m_data).m_data[2].m_data[1];
  pfVar7 = &fStack_74;
  local_98 = *pfVar8;
  fStack_94 = (mat->m_data).m_data[1].m_data[2];
  local_88 = (mat->m_data).m_data[2].m_data[2];
  fStack_84 = (mat->m_data).m_data[2].m_data[3];
  fStack_80 = (mat->m_data).m_data[3].m_data[1];
  fStack_7c = (mat->m_data).m_data[3].m_data[2];
  fStack_70 = (mat->m_data).m_data[0].m_data[2];
  fStack_6c = (mat->m_data).m_data[0].m_data[3];
  local_78 = (mat->m_data).m_data[3].m_data[3];
  fStack_74 = (mat->m_data).m_data[0].m_data[1];
  local_68 = fStack_8c;
  fStack_64 = local_88;
  fStack_60 = fStack_84;
  fStack_5c = fStack_80;
  pfVar9 = &fStack_50;
  local_58 = fStack_7c;
  fStack_54 = local_78;
  fStack_50 = fStack_74;
  fStack_4c = fStack_70;
  local_48 = fStack_6c;
  uStack_3c = uStack_90;
  pfVar6 = &fStack_2c;
  local_38 = fStack_80;
  fStack_34 = fStack_7c;
  fStack_30 = local_78;
  fStack_2c = fStack_74;
  local_28 = fStack_70;
  fStack_24 = fStack_6c;
  fStack_20 = fStack_44;
  uStack_1c = uStack_40;
  local_18 = uStack_90;
  fStack_14 = fStack_8c;
  fStack_10 = local_88;
  fStack_c = fStack_84;
  fVar1 = (mat->m_data).m_data[0].m_data[0];
  pfVar8 = local_c8;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[8] = 0.0;
  pfVar10 = &local_98;
  lVar11 = 0;
  do {
    lVar13 = 0;
    pfVar12 = pfVar8;
    do {
      *pfVar12 = pfVar10[lVar13];
      lVar13 = lVar13 + 1;
      pfVar12 = pfVar12 + 3;
    } while (lVar13 != 3);
    lVar11 = lVar11 + 1;
    pfVar8 = pfVar8 + 1;
    pfVar10 = pfVar10 + 3;
  } while (lVar11 != 3);
  fVar2 = (mat->m_data).m_data[1].m_data[0];
  pfVar8 = local_f8;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[8] = 0.0;
  lVar11 = 0;
  do {
    lVar13 = 0;
    pfVar10 = pfVar8;
    do {
      *pfVar10 = pfVar7[lVar13];
      lVar13 = lVar13 + 1;
      pfVar10 = pfVar10 + 3;
    } while (lVar13 != 3);
    lVar11 = lVar11 + 1;
    pfVar8 = pfVar8 + 1;
    pfVar7 = pfVar7 + 3;
  } while (lVar11 != 3);
  fVar3 = (mat->m_data).m_data[2].m_data[0];
  pfVar8 = local_128;
  local_128[4] = 0.0;
  local_128[5] = 0.0;
  local_128[6] = 0.0;
  local_128[7] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  local_128[8] = 0.0;
  lVar11 = 0;
  do {
    lVar13 = 0;
    pfVar7 = pfVar8;
    do {
      *pfVar7 = pfVar9[lVar13];
      lVar13 = lVar13 + 1;
      pfVar7 = pfVar7 + 3;
    } while (lVar13 != 3);
    lVar11 = lVar11 + 1;
    pfVar8 = pfVar8 + 1;
    pfVar9 = pfVar9 + 3;
  } while (lVar11 != 3);
  fVar4 = (mat->m_data).m_data[3].m_data[0];
  pfVar8 = local_158;
  local_158[4] = 0.0;
  local_158[5] = 0.0;
  local_158[6] = 0.0;
  local_158[7] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_158[8] = 0.0;
  lVar11 = 0;
  do {
    lVar13 = 0;
    pfVar7 = pfVar8;
    do {
      *pfVar7 = pfVar6[lVar13];
      lVar13 = lVar13 + 1;
      pfVar7 = pfVar7 + 3;
    } while (lVar13 != 3);
    lVar11 = lVar11 + 1;
    pfVar8 = pfVar8 + 1;
    pfVar6 = pfVar6 + 3;
  } while (lVar11 != 3);
  return ((fVar1 * ((((local_c8[6] * local_c8[1] * local_c8[5] +
                      local_c8[0] * local_c8[4] * local_c8[8] +
                      local_c8[3] * local_c8[7] * local_c8[2]) -
                     local_c8[7] * local_c8[0] * local_c8[5]) -
                    local_c8[1] * local_c8[3] * local_c8[8]) -
                   local_c8[4] * local_c8[6] * local_c8[2]) -
          ((((local_f8[6] * local_f8[1] * local_f8[5] +
             local_f8[0] * local_f8[4] * local_f8[8] + local_f8[3] * local_f8[7] * local_f8[2]) -
            local_f8[7] * local_f8[0] * local_f8[5]) - local_f8[1] * local_f8[3] * local_f8[8]) -
          local_f8[4] * local_f8[6] * local_f8[2]) * fVar2) +
         fVar3 * ((((local_128[6] * local_128[1] * local_128[5] +
                    local_128[0] * local_128[4] * local_128[8] +
                    local_128[3] * local_128[7] * local_128[2]) -
                   local_128[7] * local_128[0] * local_128[5]) -
                  local_128[1] * local_128[3] * local_128[8]) -
                 local_128[4] * local_128[6] * local_128[2])) -
         fVar4 * ((((local_158[6] * local_158[1] * local_158[5] +
                    local_158[0] * local_158[4] * local_158[8] +
                    local_158[3] * local_158[7] * local_158[2]) -
                   local_158[7] * local_158[0] * local_158[5]) -
                  local_158[1] * local_158[3] * local_158[8]) -
                 local_158[4] * local_158[6] * local_158[2]);
}

Assistant:

float determinant<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	const float minorMatrices[4][3*3] =
	{
		{
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
		}
	};

	return	+ mat(0,0) * determinant(tcu::Mat3(minorMatrices[0]))
			- mat(0,1) * determinant(tcu::Mat3(minorMatrices[1]))
			+ mat(0,2) * determinant(tcu::Mat3(minorMatrices[2]))
			- mat(0,3) * determinant(tcu::Mat3(minorMatrices[3]));
}